

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowFontAtlas(ImFontAtlas *atlas)

{
  ImVector<unsigned_int> *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImFont *font;
  bool bVar4;
  long lVar5;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec4 local_38;
  ImVec4 local_28;
  
  if (0 < (atlas->Fonts).Size) {
    lVar5 = 0;
    do {
      font = (atlas->Fonts).Data[lVar5];
      PushID(font);
      DebugNodeFont(font);
      pIVar1 = &GImGui->CurrentWindow->IDStack;
      pIVar1->Size = pIVar1->Size + -1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (atlas->Fonts).Size);
  }
  bVar4 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)atlas->TexWidth,
                   (ulong)(uint)atlas->TexHeight);
  if (bVar4) {
    local_28.x = 1.0;
    local_28.y = 1.0;
    local_28.z = 1.0;
    local_28.w = 1.0;
    local_38.x = 1.0;
    local_38.y = 1.0;
    local_38.z = 1.0;
    local_38.w = 0.5;
    uVar2 = atlas->TexWidth;
    uVar3 = atlas->TexHeight;
    local_40.y = (float)(int)uVar3;
    local_40.x = (float)(int)uVar2;
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_50.x = 1.0;
    local_50.y = 1.0;
    Image(atlas->TexID,&local_40,&local_48,&local_50,&local_28,&local_38);
    TreePop();
  }
  return;
}

Assistant:

void ImGui::ShowFontAtlas(ImFontAtlas* atlas)
{
    for (int i = 0; i < atlas->Fonts.Size; i++)
    {
        ImFont* font = atlas->Fonts[i];
        PushID(font);
        DebugNodeFont(font);
        PopID();
    }
    if (TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
    {
        ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
        ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
        Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0.0f, 0.0f), ImVec2(1.0f, 1.0f), tint_col, border_col);
        TreePop();
    }
}